

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

uint8_t __thiscall Spi::xfer_spi_bits(Spi *this,uint8_t data,int n)

{
  BYTE BVar1;
  
  if (0 < n) {
    send_byte(this,'3');
    send_byte(this,(char)n + 0xff);
    send_byte(this,data);
    BVar1 = recv_byte(this);
    return BVar1;
  }
  return '\0';
}

Assistant:

uint8_t Spi::xfer_spi_bits(uint8_t data, int n) {
	if (n < 1)
		return 0;

	/* Input and output, update data on negative edge read on positive, bits. */
	send_byte(MC_DATA_IN | MC_DATA_OUT | MC_DATA_OCN | MC_DATA_BITS);
	send_byte(n - 1);
	send_byte(data);

	return recv_byte();
}